

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O1

int ConnectPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  timespec req;
  char line [256];
  timespec local_208;
  char local_1f8;
  char local_1f7;
  int *local_f8;
  BOOL *local_f0;
  int *local_e8;
  BOOL *local_e0;
  int *local_d8;
  int *local_d0;
  BOOL *local_c8;
  int *local_c0;
  BOOL *local_b8;
  double *local_b0;
  BOOL *local_a8;
  double *local_a0;
  double *local_98;
  BOOL *local_90;
  BOOL *local_88;
  int *local_80;
  BOOL *local_78;
  BOOL *local_70;
  BOOL *local_68;
  BOOL *local_60;
  BOOL *local_58;
  BOOL *local_50;
  BOOL *local_48;
  BOOL *local_40;
  BOOL *local_38;
  
  memset(pPathfinderDVL->szCfgFilePath,0,0x100);
  sprintf(pPathfinderDVL->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_1f8,0,0x100);
    memset(pPathfinderDVL->szDevPath + 5,0,0xfb);
    builtin_strncpy(pPathfinderDVL->szDevPath,"COM1",5);
    pPathfinderDVL->BaudRate = 0x1c200;
    pPathfinderDVL->timeout = 0x5dc;
    pPathfinderDVL->threadperiod = 100;
    pPathfinderDVL->bSaveRawData = 1;
    pPathfinderDVL->StartupDelay = 4000;
    pPathfinderDVL->bSendBreak = 1;
    pPathfinderDVL->BreakMode = 1;
    pPathfinderDVL->BreakDuration = 300;
    pPathfinderDVL->bRetrieveParameters = 1;
    pPathfinderDVL->Parameters = 1;
    pPathfinderDVL->bSetHeadingAlignment = 1;
    pPathfinderDVL->HeadingAlignment = 45.0;
    pPathfinderDVL->bSetRollPitchMisalignment = 0;
    pPathfinderDVL->RollMisalignment = 0.0;
    pPathfinderDVL->PitchMisalignment = 0.0;
    pPathfinderDVL->bUpOrientation = 0;
    pPathfinderDVL->bSelectDataStream = 1;
    pPathfinderDVL->DataStream = 6;
    pPathfinderDVL->bEnableAutoPing = 0;
    pPathfinderDVL->bKeepAsUserDefaults = 1;
    pPathfinderDVL->bStartPinging = 1;
    pPathfinderDVL->bEnable_PD6_SA = 0;
    pPathfinderDVL->bEnable_PD6_TS = 0;
    pPathfinderDVL->bEnable_PD6_BI = 0;
    pPathfinderDVL->bEnable_PD6_BS = 1;
    pPathfinderDVL->bEnable_PD6_BE = 0;
    pPathfinderDVL->bEnable_PD6_BD = 0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      local_f8 = &pPathfinderDVL->threadperiod;
      local_f0 = &pPathfinderDVL->bSaveRawData;
      local_e8 = &pPathfinderDVL->StartupDelay;
      local_e0 = &pPathfinderDVL->bSendBreak;
      local_d8 = &pPathfinderDVL->BreakMode;
      local_d0 = &pPathfinderDVL->BreakDuration;
      local_c8 = &pPathfinderDVL->bRetrieveParameters;
      local_c0 = &pPathfinderDVL->Parameters;
      local_b8 = &pPathfinderDVL->bSetHeadingAlignment;
      local_b0 = &pPathfinderDVL->HeadingAlignment;
      local_a8 = &pPathfinderDVL->bSetRollPitchMisalignment;
      local_a0 = &pPathfinderDVL->RollMisalignment;
      local_98 = &pPathfinderDVL->PitchMisalignment;
      local_90 = &pPathfinderDVL->bUpOrientation;
      local_88 = &pPathfinderDVL->bSelectDataStream;
      local_80 = &pPathfinderDVL->DataStream;
      local_78 = &pPathfinderDVL->bEnableAutoPing;
      local_70 = &pPathfinderDVL->bKeepAsUserDefaults;
      local_68 = &pPathfinderDVL->bStartPinging;
      local_60 = &pPathfinderDVL->bEnable_PD6_SA;
      local_58 = &pPathfinderDVL->bEnable_PD6_TS;
      local_50 = &pPathfinderDVL->bEnable_PD6_BI;
      local_48 = &pPathfinderDVL->bEnable_PD6_BS;
      local_40 = &pPathfinderDVL->bEnable_PD6_BE;
      local_38 = &pPathfinderDVL->bEnable_PD6_BD;
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001aee6f;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001aee6f:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%255s",pPathfinderDVL->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001aeeee;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001aeeee:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",&pPathfinderDVL->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001aef6d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001aef6d:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",&pPathfinderDVL->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001aefec;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001aefec:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_f8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af070;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af070:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_f0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af0f4;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af0f4:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_e8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af178;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af178:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_e0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af1fc;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af1fc:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_d8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af280;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af280:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_d0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af304;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af304:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_c8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af388;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af388:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_c0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af40c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af40c:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_b8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af490;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af490:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%lf",local_b0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af514;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af514:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_a8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af598;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af598:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%lf",local_a0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af61c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af61c:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%lf",local_98);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af6a0;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af6a0:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_90);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af724;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af724:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_88);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af7a8;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af7a8:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_80);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af82c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af82c:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_78);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af8b0;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af8b0:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_70);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af934;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af934:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_68);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001af9b8;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001af9b8:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_60);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001afa3c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001afa3c:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_58);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001afac0;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001afac0:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_50);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001afb44;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001afb44:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_48);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001afbc8;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001afbc8:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_40);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_1f8,0x100,__stream), local_1f8 != '#' && (local_1f8 != '%')))
        {
          if ((local_1f8 != '/') || ((pcVar2 == (char *)0x0 || (local_1f7 != '/'))))
          goto LAB_001afc4c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001afc4c:
      if (pcVar2 == (char *)0x0 || local_1f8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_1f8,"%d",local_38);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001afcb5;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001afcb5:
  if (pPathfinderDVL->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pPathfinderDVL->threadperiod = 100;
  }
  if (pPathfinderDVL->BreakDuration < 0) {
    puts("Invalid parameter : BreakDuration.");
    pPathfinderDVL->BreakDuration = 300;
  }
  if (2 < (uint)pPathfinderDVL->Parameters) {
    puts("Invalid parameter : Parameters.");
    pPathfinderDVL->Parameters = 1;
  }
  if (0xd < (uint)pPathfinderDVL->DataStream) {
    puts("Invalid parameter : DataStream.");
    pPathfinderDVL->DataStream = 6;
  }
  local_208.tv_sec = (long)pPathfinderDVL->StartupDelay / 1000;
  local_208.tv_nsec = ((long)pPathfinderDVL->StartupDelay % 1000) * 1000000;
  nanosleep(&local_208,(timespec *)0x0);
  iVar1 = OpenRS232Port(&pPathfinderDVL->RS232Port,pPathfinderDVL->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a PathfinderDVL.");
    return 1;
  }
  iVar1 = (pPathfinderDVL->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((pPathfinderDVL->RS232Port).hDev,pPathfinderDVL->BaudRate,'\0',0,'\b',
                           '\0',pPathfinderDVL->timeout), iVar1 != 0)) {
      pcVar2 = "Unable to connect to a PathfinderDVL.";
      goto LAB_001b003c;
    }
    tcflush(*(int *)&(pPathfinderDVL->RS232Port).hDev,2);
  }
  local_208.tv_sec = 0;
  local_208.tv_nsec = 100000000;
  nanosleep(&local_208,(timespec *)0x0);
  if (pPathfinderDVL->bSendBreak != 0) {
    iVar1 = SendBreakPathfinderDVL
                      (pPathfinderDVL,pPathfinderDVL->BreakMode,pPathfinderDVL->BreakDuration);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : break failed.";
      goto LAB_001b003c;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 500000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bRetrieveParameters != 0) {
    iVar1 = RetrieveParametersPathfinderDVL(pPathfinderDVL,pPathfinderDVL->Parameters);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CR command failed.";
      goto LAB_001b003c;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bSetHeadingAlignment != 0) {
    iVar1 = SetHeadingAlignmentPathfinderDVL(pPathfinderDVL,pPathfinderDVL->HeadingAlignment);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : EA command failed.";
      goto LAB_001b003c;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bSetRollPitchMisalignment != 0) {
    iVar1 = SetRollPitchMisalignmentPathfinderDVL
                      (pPathfinderDVL,pPathfinderDVL->RollMisalignment,
                       pPathfinderDVL->PitchMisalignment);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : #EI or #EJ commands failed.";
      goto LAB_001b003c;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bUpOrientation != 0) {
    iVar1 = SetUpDownOrientationPathfinderDVL(pPathfinderDVL,pPathfinderDVL->bUpOrientation);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : EU command failed.";
      goto LAB_001b003c;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bSelectDataStream != 0) {
    iVar1 = SelectDataStreamPathfinderDVL(pPathfinderDVL,pPathfinderDVL->DataStream);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : PD command failed.";
      goto LAB_001b003c;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bEnableAutoPing != 0) {
    iVar1 = SetTurnkeyPathfinderDVL(pPathfinderDVL,pPathfinderDVL->bEnableAutoPing);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CT command failed.";
      goto LAB_001b003c;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bKeepAsUserDefaults != 0) {
    iVar1 = KeepAsUserDefaultsPathfinderDVL(pPathfinderDVL);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CK command failed.";
      goto LAB_001b003c;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  if (pPathfinderDVL->bStartPinging != 0) {
    iVar1 = StartPingingPathfinderDVL(pPathfinderDVL);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CS command failed.";
LAB_001b003c:
      puts(pcVar2);
      CloseRS232Port(&pPathfinderDVL->RS232Port);
      return 1;
    }
    local_208.tv_sec = 0;
    local_208.tv_nsec = 100000000;
    nanosleep(&local_208,(timespec *)0x0);
  }
  puts("PathfinderDVL connected.");
  return 0;
}

Assistant:

inline int ConnectPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pPathfinderDVL->szCfgFilePath, 0, sizeof(pPathfinderDVL->szCfgFilePath));
	sprintf(pPathfinderDVL->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pPathfinderDVL->szDevPath, 0, sizeof(pPathfinderDVL->szDevPath));
		sprintf(pPathfinderDVL->szDevPath, "COM1");
		pPathfinderDVL->BaudRate = 115200;
		pPathfinderDVL->timeout = 1500;
		pPathfinderDVL->threadperiod = 100;
		pPathfinderDVL->bSaveRawData = 1;
		pPathfinderDVL->StartupDelay = 4000;
		pPathfinderDVL->bSendBreak = 1;
		pPathfinderDVL->BreakMode = 1;
		pPathfinderDVL->BreakDuration = 300;
		pPathfinderDVL->bRetrieveParameters = 1;
		pPathfinderDVL->Parameters = 1;
		pPathfinderDVL->bSetHeadingAlignment = 1;
		pPathfinderDVL->HeadingAlignment = 45;
		pPathfinderDVL->bSetRollPitchMisalignment = 0;
		pPathfinderDVL->RollMisalignment = 0;
		pPathfinderDVL->PitchMisalignment = 0;
		pPathfinderDVL->bUpOrientation = 0;
		pPathfinderDVL->bSelectDataStream = 1;
		pPathfinderDVL->DataStream = 6;
		pPathfinderDVL->bEnableAutoPing = 0;
		pPathfinderDVL->bKeepAsUserDefaults = 1;
		pPathfinderDVL->bStartPinging = 1;
		pPathfinderDVL->bEnable_PD6_SA = 0;
		pPathfinderDVL->bEnable_PD6_TS = 0;
		pPathfinderDVL->bEnable_PD6_BI = 0;
		pPathfinderDVL->bEnable_PD6_BS = 1;
		pPathfinderDVL->bEnable_PD6_BE = 0;
		pPathfinderDVL->bEnable_PD6_BD = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pPathfinderDVL->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->StartupDelay) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSendBreak) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BreakMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BreakDuration) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bRetrieveParameters) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->Parameters) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSetHeadingAlignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->HeadingAlignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSetRollPitchMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->RollMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->PitchMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bUpOrientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSelectDataStream) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->DataStream) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnableAutoPing) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bKeepAsUserDefaults) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bStartPinging) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_SA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_TS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BI) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BE) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BD) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}
	
	if (pPathfinderDVL->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pPathfinderDVL->threadperiod = 100;
	}
	if (pPathfinderDVL->BreakDuration < 0)
	{
		printf("Invalid parameter : BreakDuration.\n");
		pPathfinderDVL->BreakDuration = 300;
	}
	if ((pPathfinderDVL->Parameters < 0)||(pPathfinderDVL->Parameters > 2))
	{
		printf("Invalid parameter : Parameters.\n");
		pPathfinderDVL->Parameters = 1;
	}
	if ((pPathfinderDVL->DataStream < 0)||(pPathfinderDVL->DataStream > 13))
	{
		printf("Invalid parameter : DataStream.\n");
		pPathfinderDVL->DataStream = 6;
	}

	// Used to save raw data, should be handled specifically...
	//pPathfinderDVL->pfSaveFile = NULL;

	//pPathfinderDVL->LastAltitude = 0;
	
	// When the DVL restarts, it might silently miss the first commands if it is not yet ready
	// (however this is unlikely to be a real problem as long as the correct parameters were saved).
	// Or maybe try to send break and retry until their is the prompt?
	mSleep(pPathfinderDVL->StartupDelay);

	if (OpenRS232Port(&pPathfinderDVL->RS232Port, pPathfinderDVL->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a PathfinderDVL.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pPathfinderDVL->RS232Port, pPathfinderDVL->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pPathfinderDVL->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a PathfinderDVL.\n");
		CloseRS232Port(&pPathfinderDVL->RS232Port);
		return EXIT_FAILURE;
	}
	
	mSleep(100);

	if (pPathfinderDVL->bSendBreak)
	{
		if (SendBreakPathfinderDVL(pPathfinderDVL, pPathfinderDVL->BreakMode, pPathfinderDVL->BreakDuration) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : break failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(500);
	}

	if (pPathfinderDVL->bRetrieveParameters)
	{
		if (RetrieveParametersPathfinderDVL(pPathfinderDVL, pPathfinderDVL->Parameters) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CR command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSetHeadingAlignment)
	{
		if (SetHeadingAlignmentPathfinderDVL(pPathfinderDVL, pPathfinderDVL->HeadingAlignment) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : EA command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSetRollPitchMisalignment)
	{
		if (SetRollPitchMisalignmentPathfinderDVL(pPathfinderDVL, pPathfinderDVL->RollMisalignment, pPathfinderDVL->PitchMisalignment) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : #EI or #EJ commands failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bUpOrientation)
	{
		if (SetUpDownOrientationPathfinderDVL(pPathfinderDVL, pPathfinderDVL->bUpOrientation) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : EU command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSelectDataStream)
	{
		if (SelectDataStreamPathfinderDVL(pPathfinderDVL, pPathfinderDVL->DataStream) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : PD command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bEnableAutoPing)
	{
		if (SetTurnkeyPathfinderDVL(pPathfinderDVL, pPathfinderDVL->bEnableAutoPing) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CT command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bKeepAsUserDefaults)
	{
		if (KeepAsUserDefaultsPathfinderDVL(pPathfinderDVL) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CK command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bStartPinging)
	{
		if (StartPingingPathfinderDVL(pPathfinderDVL) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CS command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}
	
	printf("PathfinderDVL connected.\n");

	return EXIT_SUCCESS;
}